

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetPointerType
          (InterfaceVariableScalarReplacement *this,uint32_t type_id,StorageClass storage_class)

{
  uint32_t uVar1;
  IRContext *pIVar2;
  TypeManager *pTVar3;
  undefined1 local_58 [8];
  Pointer ptr_type;
  Type *type;
  StorageClass storage_class_local;
  uint32_t type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  pIVar2 = Pass::context(&this->super_Pass);
  pTVar3 = IRContext::get_type_mgr(pIVar2);
  ptr_type._48_8_ = analysis::TypeManager::GetType(pTVar3,type_id);
  analysis::Pointer::Pointer((Pointer *)local_58,(Type *)ptr_type._48_8_,storage_class);
  pIVar2 = Pass::context(&this->super_Pass);
  pTVar3 = IRContext::get_type_mgr(pIVar2);
  uVar1 = analysis::TypeManager::GetTypeInstruction(pTVar3,(Type *)local_58);
  analysis::Pointer::~Pointer((Pointer *)local_58);
  return uVar1;
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetPointerType(
    uint32_t type_id, spv::StorageClass storage_class) {
  analysis::Type* type = context()->get_type_mgr()->GetType(type_id);
  analysis::Pointer ptr_type(type, storage_class);
  return context()->get_type_mgr()->GetTypeInstruction(&ptr_type);
}